

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O1

void * __thiscall kj::Arena::allocateBytesInternal(Arena *this,size_t amount,uint alignment)

{
  byte *pbVar1;
  size_t sVar2;
  void *pvVar3;
  ChunkHeader *pCVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uintptr_t mask;
  ulong uVar8;
  
  pCVar4 = this->currentChunk;
  if (pCVar4 != (ChunkHeader *)0x0) {
    pbVar1 = pCVar4->pos;
    pvVar3 = (void *)(~(ulong)(alignment - 1) & (ulong)(pbVar1 + (alignment - 1)));
    if ((amount - (long)pbVar1) + (long)pvVar3 <= (ulong)((long)pCVar4->end - (long)pbVar1)) {
      pCVar4->pos = (byte *)(amount + (long)pvVar3);
      return pvVar3;
    }
  }
  uVar7 = 8;
  if (8 < alignment) {
    uVar7 = alignment;
  }
  uVar8 = (ulong)(uVar7 - 1);
  uVar6 = (uVar8 + 0x18 & ~uVar8) + amount;
  uVar5 = this->nextChunkSize;
  if (uVar5 < uVar6) {
    do {
      uVar5 = uVar5 * 2;
    } while (uVar5 < uVar6);
    this->nextChunkSize = uVar5;
  }
  pCVar4 = (ChunkHeader *)operator_new(uVar5);
  pCVar4->next = this->chunkList;
  pCVar4->pos = (byte *)((long)&pCVar4->next + uVar6);
  sVar2 = this->nextChunkSize;
  pCVar4->end = (byte *)((long)&pCVar4->next + sVar2);
  this->currentChunk = pCVar4;
  this->chunkList = pCVar4;
  this->nextChunkSize = sVar2 * 2;
  return (void *)((long)&pCVar4[1].next + uVar8 & ~uVar8);
}

Assistant:

void* Arena::allocateBytesInternal(size_t amount, uint alignment) {
  if (currentChunk != nullptr) {
    ChunkHeader* chunk = currentChunk;
    byte* alignedPos = alignTo(chunk->pos, alignment);

    // Careful about overflow here.
    if (amount + (alignedPos - chunk->pos) <= chunk->end - chunk->pos) {
      // There's enough space in this chunk.
      chunk->pos = alignedPos + amount;
      return alignedPos;
    }
  }

  // Not enough space in the current chunk.  Allocate a new one.

  // We need to allocate at least enough space for the ChunkHeader and the requested allocation.

  // If the alignment is less than that of the chunk header, we'll need to increase it.
  alignment = kj::max(alignment, alignof(ChunkHeader));

  // If the ChunkHeader size does not match the alignment, we'll need to pad it up.
  amount += alignTo(sizeof(ChunkHeader), alignment);

  // Make sure we're going to allocate enough space.
  while (nextChunkSize < amount) {
    nextChunkSize *= 2;
  }

  // Allocate.
  byte* bytes = reinterpret_cast<byte*>(operator new(nextChunkSize));

  // Set up the ChunkHeader at the beginning of the allocation.
  ChunkHeader* newChunk = reinterpret_cast<ChunkHeader*>(bytes);
  newChunk->next = chunkList;
  newChunk->pos = bytes + amount;
  newChunk->end = bytes + nextChunkSize;
  currentChunk = newChunk;
  chunkList = newChunk;
  nextChunkSize *= 2;

  // Move past the ChunkHeader to find the position of the allocated object.
  return alignTo(bytes + sizeof(ChunkHeader), alignment);
}